

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

View * __thiscall gimage::View::operator=(View *this,View *v)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t __n;
  long lVar4;
  
  if (this != v) {
    if (this->camera != (Camera *)0x0) {
      (*this->camera->_vptr_Camera[1])();
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (&this->image,(v->image).width,(v->image).height,(long)(v->image).depth);
    sVar1 = (this->image).n;
    __n = -sVar1;
    if (0 < (long)sVar1) {
      __n = sVar1;
    }
    memcpy((this->image).pixel,(v->image).pixel,__n);
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (&this->depth,(v->depth).width,(v->depth).height,(long)(v->depth).depth);
    lVar2 = (this->depth).n;
    lVar4 = -lVar2;
    if (0 < lVar2) {
      lVar4 = lVar2;
    }
    memcpy((this->depth).pixel,(v->depth).pixel,lVar4 << 2);
    iVar3 = (*v->camera->_vptr_Camera[2])();
    this->camera = (Camera *)CONCAT44(extraout_var,iVar3);
  }
  return this;
}

Assistant:

View &View::operator=(const View &v)
{
  if (this != &v)
  {
    delete camera;

    image=v.image;
    depth=v.depth;
    camera=v.getCamera()->clone();
  }

  return *this;
}